

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

bool __thiscall QItemSelectionModel::isSelected(QItemSelectionModel *this,QModelIndex *index)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_00;
  QItemSelection *this_01;
  QItemSelectionRange *pQVar1;
  long lVar2;
  QAbstractItemModel *pQVar3;
  bool bVar4;
  uint uVar5;
  parameter_type pQVar6;
  QItemSelectionRange *pQVar7;
  long lVar8;
  long lVar9;
  QItemSelectionRange *this_02;
  
  lVar2 = *(long *)(this + 8);
  this_00 = (QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
             *)(lVar2 + 0x78);
  pQVar6 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
           ::value(this_00);
  if (pQVar6 != (index->m).ptr) {
    return false;
  }
  bVar4 = QModelIndex::isValid(index);
  if (!bVar4) {
    return false;
  }
  this_02 = *(QItemSelectionRange **)(lVar2 + 0x88);
  lVar8 = *(long *)(lVar2 + 0x90);
  lVar9 = lVar8 * 0x10;
  pQVar1 = this_02 + lVar8;
  for (lVar8 = lVar8 >> 2; 0 < lVar8; lVar8 = lVar8 + -1) {
    bVar4 = QItemSelectionRange::contains(this_02,index);
    pQVar7 = this_02;
    if (bVar4) goto LAB_004042dc;
    bVar4 = QItemSelectionRange::contains(this_02 + 1,index);
    pQVar7 = this_02 + 1;
    if (bVar4) goto LAB_004042dc;
    bVar4 = QItemSelectionRange::contains(this_02 + 2,index);
    pQVar7 = this_02 + 2;
    if (bVar4) goto LAB_004042dc;
    bVar4 = QItemSelectionRange::contains(this_02 + 3,index);
    pQVar7 = this_02 + 3;
    if (bVar4) goto LAB_004042dc;
    this_02 = this_02 + 4;
    lVar9 = lVar9 + -0x40;
  }
  lVar9 = lVar9 >> 4;
  if (lVar9 == 1) {
LAB_0040439a:
    bVar4 = QItemSelectionRange::contains(this_02,index);
    pQVar7 = this_02;
    if (!bVar4) {
      pQVar7 = pQVar1;
    }
  }
  else if (lVar9 == 2) {
LAB_00404380:
    bVar4 = QItemSelectionRange::contains(this_02,index);
    pQVar7 = this_02;
    if (!bVar4) {
      this_02 = this_02 + 1;
      goto LAB_0040439a;
    }
  }
  else {
    pQVar7 = pQVar1;
    if ((lVar9 == 3) &&
       (bVar4 = QItemSelectionRange::contains(this_02,index), pQVar7 = this_02, !bVar4)) {
      this_02 = this_02 + 1;
      goto LAB_00404380;
    }
  }
LAB_004042dc:
  if (*(long *)(lVar2 + 0xa8) != 0) {
    this_01 = (QItemSelection *)(lVar2 + 0x98);
    uVar5 = *(uint *)(lVar2 + 0xb8);
    if ((uVar5 & 4) != 0 && pQVar7 != pQVar1) {
      bVar4 = QItemSelection::contains(this_01,index);
      if (bVar4) {
        return false;
      }
      goto LAB_00404337;
    }
    if ((uVar5 & 8) != 0) {
      bVar4 = QItemSelection::contains(this_01,index);
      if (bVar4 == (pQVar7 != pQVar1)) {
        return false;
      }
      goto LAB_00404337;
    }
    if ((uVar5 & 2) != 0 && pQVar7 == pQVar1) {
      bVar4 = QItemSelection::contains(this_01,index);
      if (!bVar4) {
        return false;
      }
      goto LAB_00404337;
    }
  }
  if (pQVar7 == pQVar1) {
    return false;
  }
LAB_00404337:
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  ::value(this_00);
  pQVar3 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
  uVar5 = (*(pQVar3->super_QObject)._vptr_QObject[0x27])(pQVar3,index);
  return (~uVar5 & 0x21) == 0;
}

Assistant:

bool QItemSelectionModel::isSelected(const QModelIndex &index) const
{
    Q_D(const QItemSelectionModel);
    if (d->model != index.model() || !index.isValid())
        return false;

    //  search model ranges
    auto contains = [](const auto &index) {
        return [&index](const auto &range) { return range.contains(index); };
    };
    bool selected = std::any_of(d->ranges.begin(), d->ranges.end(), contains(index));

    // check  currentSelection
    if (d->currentSelection.size()) {
        if ((d->currentCommand & Deselect) && selected)
            selected = !d->currentSelection.contains(index);
        else if (d->currentCommand & Toggle)
            selected ^= d->currentSelection.contains(index);
        else if ((d->currentCommand & Select) && !selected)
            selected = d->currentSelection.contains(index);
    }

    if (selected)
        return isSelectableAndEnabled(d->model->flags(index));

    return false;
}